

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>> *this,
          VectorBlock<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1> *essential
          ,Scalar *tau,Scalar *workspace)

{
  Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false> *local_1d0
  ;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> tmp;
  undefined1 local_1a8 [40];
  Nested local_180;
  Index IStack_178;
  Index local_170;
  scalar_multiple_op<double> local_168;
  Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false> bottom;
  CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>
  local_118;
  
  if (*(long *)(this + 8) == 1) {
    local_118.m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_>.m_storage.m_data.
    array[0] = 1.0 - *tau;
    DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)this
               ,(Scalar *)&local_118);
  }
  else {
    MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>::MapBase
              ((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)&tmp,workspace,*(Index *)(this + 0x10));
    Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_-1,_-1,_false>::Block
              (&bottom,(Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)this,1,0,
               *(long *)(this + 8) + -1,*(Index *)(this + 0x10));
    local_1a8._0_8_ =
         (essential->
         super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
         .m_data;
    local_1a8._8_8_ =
         (essential->
         super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
         .m_rows.m_value;
    local_1a8._24_8_ =
         (essential->
         super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
         .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data;
    local_180 = (essential->
                super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                ).
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                .m_xpr.
                super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr;
    IStack_178 = (essential->
                 super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                 ).
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                 .m_xpr.
                 super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
                 m_outerStride;
    local_170 = (essential->
                super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                ).
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                .m_outerStride;
    CoeffBasedProduct<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,-1,1,false>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>,-1,-1,false>const,6>
    ::
    CoeffBasedProduct<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,_1,_1,false>>
              ((CoeffBasedProduct<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,_1,_1,false>const,6>
                *)&local_118,
               (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)local_1a8,&bottom);
    DenseBase<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,4>,0,Eigen::Stride<0,0>>>::
    lazyAssign<Eigen::CoeffBasedProduct<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,_1,_1,false>const,6>>
              ((DenseBase<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,4>,0,Eigen::Stride<0,0>>> *)&tmp,
               (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_6>_>
                *)&local_118);
    Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1,_-1,_false>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>
                *)&local_118,(Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,4>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,4>,0,Eigen::Stride<0,0>>> *)&tmp
               ,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
                 *)&local_118);
    local_1a8._32_8_ = *tau;
    local_1a8._0_8_ =
         tmp.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data;
    local_1a8._16_8_ =
         tmp.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1,_-1,_false>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>
                *)&local_118,(Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>,1,-1,false>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,1,_1,false>>
                *)&local_118,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)local_1a8);
    local_168.m_other = *tau;
    local_1a8._0_8_ =
         (essential->
         super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
         .m_data;
    local_1a8._8_8_ =
         (essential->
         super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
         .m_rows.m_value;
    local_1a8._24_8_ =
         (essential->
         super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
         .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data;
    local_180 = (essential->
                super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                ).
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                .m_xpr.
                super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr;
    IStack_178 = (essential->
                 super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                 ).
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                 .m_xpr.
                 super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
                 m_outerStride;
    local_170 = (essential->
                super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                ).
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                .m_outerStride;
    CoeffBasedProduct<Eigen::Matrix<double,-1,1,0,4,1>,Eigen::Map<Eigen::Matrix<double,1,-1,1,1,4>,0,Eigen::Stride<0,0>>const,256>
    ::
    CoeffBasedProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,4>,0,Eigen::Stride<0,0>>>
              ((CoeffBasedProduct<Eigen::Matrix<double,_1,1,0,4,1>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,4>,0,Eigen::Stride<0,0>>const,256>
                *)&local_118,
               (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)local_1a8,&tmp);
    local_1d0 = &bottom;
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>,-1,-1,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,_1,_1,false>,Eigen::MatrixBase>
                  *)&local_1d0,&local_118);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}